

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dsa.cc
# Opt level: O1

void DSA_get0_pqg(DSA *dsa,BIGNUM **out_p,BIGNUM **out_q,BIGNUM **out_g)

{
  if (out_p != (BIGNUM **)0x0) {
    *out_p = dsa->p;
  }
  if (out_q != (BIGNUM **)0x0) {
    *out_q = dsa->q;
  }
  if (out_g != (BIGNUM **)0x0) {
    *out_g = dsa->g;
  }
  return;
}

Assistant:

void DSA_get0_pqg(const DSA *dsa, const BIGNUM **out_p, const BIGNUM **out_q,
                  const BIGNUM **out_g) {
  if (out_p != NULL) {
    *out_p = dsa->p;
  }
  if (out_q != NULL) {
    *out_q = dsa->q;
  }
  if (out_g != NULL) {
    *out_g = dsa->g;
  }
}